

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O2

ResourceAttribs * __thiscall
Diligent::ShaderVariableManagerVk::GetResourceAttribs(ShaderVariableManagerVk *this,Uint32 Index)

{
  PipelineResourceAttribsType *pPVar1;
  char (*in_RCX) [13];
  PipelineResourceSignatureType *this_00;
  string msg;
  string local_38;
  
  this_00 = (this->
            super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
            ).m_pSignature;
  if (this_00 == (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pSignature",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = (this->
              super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
              ).m_pSignature;
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                     (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                      Index);
  return pPVar1;
}

Assistant:

const ShaderVariableManagerVk::ResourceAttribs& ShaderVariableManagerVk::GetResourceAttribs(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceAttribs(Index);
}